

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logException
          (RootExceptionCallback *this,LogSeverity severity,Exception *e)

{
  LogSeverity LVar1;
  bool bVar2;
  uint uVar3;
  ExceptionCallback *params_6;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ArrayPtr<void_*const> AVar7;
  String local_c0;
  ArrayPtr<void_*const> local_a8;
  String local_98;
  ArrayPtr<void_*const> local_80;
  undefined1 local_70 [24];
  ArrayPtr<const_char> local_58;
  char *local_48;
  Type local_3c;
  String local_38;
  Exception *local_20;
  Exception *e_local;
  RootExceptionCallback *pRStack_10;
  LogSeverity severity_local;
  RootExceptionCallback *this_local;
  
  local_20 = e;
  e_local._4_4_ = severity;
  pRStack_10 = this;
  params_6 = getExceptionCallback();
  LVar1 = e_local._4_4_;
  pcVar4 = Exception::getFile(local_20);
  uVar3 = Exception::getLine(local_20);
  local_3c = Exception::getType(local_20);
  local_58 = (ArrayPtr<const_char>)Exception::getDescription(local_20);
  bVar2 = StringPtr::operator==((StringPtr *)&local_58,(void *)0x0);
  local_48 = ": ";
  if (bVar2) {
    local_48 = "";
  }
  local_70._8_16_ = (undefined1  [16])Exception::getDescription(local_20);
  local_80 = Exception::getStackTrace(local_20);
  sVar5 = ArrayPtr<void_*const>::size(&local_80);
  local_70._0_8_ = "";
  pcVar6 = "\nstack: ";
  if (sVar5 != 0) {
    local_70._0_8_ = "\nstack: ";
  }
  local_a8 = Exception::getStackTrace(local_20);
  AVar7.size_ = (size_t)pcVar6;
  AVar7.ptr = (void **)local_a8.size_;
  stringifyStackTraceAddresses(&local_98,(kj *)local_a8.ptr,AVar7);
  AVar7 = Exception::getStackTrace(local_20);
  stringifyStackTrace(&local_c0,AVar7);
  str<kj::Exception::Type,char_const*,kj::StringPtr,char_const*,kj::String,kj::String,char_const(&)[2]>
            (&local_38,(kj *)&local_3c,(Type *)&local_48,(char **)(local_70 + 8),
             (StringPtr *)local_70,(char **)&local_98,&local_c0,(String *)0x418bbb,
             (char (*) [2])params_6);
  (*params_6->_vptr_ExceptionCallback[4])(params_6,(ulong)LVar1,pcVar4,(ulong)uVar3,0,&local_38);
  String::~String(&local_38);
  String::~String(&local_c0);
  String::~String(&local_98);
  return;
}

Assistant:

void logException(LogSeverity severity, Exception&& e) {
    // We intentionally go back to the top exception callback on the stack because we don't want to
    // bypass whatever log processing is in effect.
    //
    // We intentionally don't log the context since it should get re-added by the exception callback
    // anyway.
    getExceptionCallback().logMessage(severity, e.getFile(), e.getLine(), 0, str(
        e.getType(), e.getDescription() == nullptr ? "" : ": ", e.getDescription(),
        e.getStackTrace().size() > 0 ? "\nstack: " : "",
        stringifyStackTraceAddresses(e.getStackTrace()),
        stringifyStackTrace(e.getStackTrace()), "\n"));
  }